

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void save_template_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  Fl_Window_Type *this;
  Fl_Double_Window *__stat_loc;
  char *pcVar6;
  uchar *puVar7;
  png_structp pptr;
  int h;
  int w;
  png_infop iptr;
  char filename [2048];
  char safename [2048];
  
  if (template_panel == (Fl_Double_Window *)0x0) {
    make_template_panel();
  }
  template_clear();
  Fl_Browser::add(template_browser,"New Template",(void *)0x0);
  template_load();
  (*(template_name->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl_Input_::value(&template_name->super_Fl_Input_,"");
  (*(template_instance->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])();
  (*(template_delete->super_Fl_Widget)._vptr_Fl_Widget[5])();
  Fl_Widget::deactivate(&template_delete->super_Fl_Widget);
  Fl_Widget::label((Fl_Widget *)template_submit,"Save");
  Fl_Widget::deactivate((Fl_Widget *)template_submit);
  Fl_Window::label(&template_panel->super_Fl_Window,"Save Template");
  __stat_loc = template_panel;
  (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  while ((template_panel->super_Fl_Window).i != (Fl_X *)0x0) {
    Fl::wait(__stat_loc);
  }
  pcVar5 = (template_name->super_Fl_Input_).value_;
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    fl_strlcpy(safename,pcVar5,0x800);
    if (safename[0] != '\0') {
      pcVar6 = safename;
      do {
        pcVar6 = pcVar6 + 1;
        iVar1 = isspace((int)safename[0]);
        if (iVar1 != 0) {
          pcVar6[-1] = '_';
        }
        safename[0] = *pcVar6;
      } while (safename[0] != '\0');
    }
    Fl_Preferences::getUserdataPath(&fluid_prefs,filename,0x800);
    fl_strlcat(filename,"templates",0x800);
    iVar1 = access(filename,0);
    if (iVar1 != 0) {
      mkdir(filename,0x1ff);
    }
    fl_strlcat(filename,"/",0x800);
    fl_strlcat(filename,safename,0x800);
    sVar2 = strlen(filename);
    if ((long)sVar2 < 0x7fb) {
      builtin_strncpy(filename + sVar2,".fl",4);
      iVar1 = access(filename,0);
      if ((iVar1 != 0) ||
         (iVar1 = fl_choice("The template \"%s\" already exists.\nDo you want to replace it?",
                            "Cancel","Replace",(char *)0x0,pcVar5), iVar1 != 0)) {
        iVar1 = write_file(filename,0);
        this = (Fl_Window_Type *)Fl_Type::first;
        if (iVar1 == 0) {
LAB_00199827:
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fl_alert("Error writing %s: %s",filename,pcVar5);
        }
        else {
          for (; this != (Fl_Window_Type *)0x0;
              this = (Fl_Window_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next) {
            iVar1 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x21])(this);
            if (iVar1 != 0) {
              puVar3 = Fl_Window_Type::read_image(this,&w,&h);
              if (puVar3 == (uchar *)0x0) {
                return;
              }
              builtin_strncpy(filename + sVar2,".png",5);
              __stream = (FILE *)fl_fopen(filename,"wb");
              if (__stream != (FILE *)0x0) {
                pptr = (png_structp)png_create_write_struct("1.6.37",0,0,0);
                iptr = (png_infop)png_create_info_struct(pptr);
                png_init_io(pptr,__stream);
                png_set_IHDR(pptr,iptr,w,h,8,2,0,0,0);
                png_set_sRGB(pptr,iptr,0);
                png_write_info(pptr,iptr);
                if (0 < h) {
                  iVar1 = h + 1;
                  puVar7 = puVar3;
                  do {
                    png_write_row(pptr,puVar7);
                    puVar7 = puVar7 + (long)w * 3;
                    iVar1 = iVar1 + -1;
                  } while (1 < iVar1);
                }
                png_write_end(pptr,iptr);
                png_destroy_write_struct(&pptr,&iptr);
                fclose(__stream);
                operator_delete__(puVar3);
                return;
              }
              operator_delete__(puVar3);
              goto LAB_00199827;
            }
          }
        }
      }
    }
    else {
      fl_alert("The template name \"%s\" is too long!",pcVar5);
    }
  }
  return;
}

Assistant:

void save_template_cb(Fl_Widget *, void *) {
  // Setup the template panel...
  if (!template_panel) make_template_panel();

  template_clear();
  template_browser->add("New Template");
  template_load();

  template_name->show();
  template_name->value("");

  template_instance->hide();

  template_delete->show();
  template_delete->deactivate();

  template_submit->label("Save");
  template_submit->deactivate();

  template_panel->label("Save Template");

  // Show the panel and wait for the user to do something...
  template_panel->show();
  while (template_panel->shown()) Fl::wait();

  // Get the template name, return if it is empty...
  const char *c = template_name->value();
  if (!c || !*c) return;

  // Convert template name to filename_with_underscores
  char safename[FL_PATH_MAX], *safeptr;
  strlcpy(safename, c, sizeof(safename));
  for (safeptr = safename; *safeptr; safeptr ++) {
    if (isspace(*safeptr)) *safeptr = '_';
  }

  // Find the templates directory...
  char filename[FL_PATH_MAX];
  fluid_prefs.getUserdataPath(filename, sizeof(filename));

  strlcat(filename, "templates", sizeof(filename));
#if defined(WIN32) && !defined(__CYGWIN__)
  if (access(filename, 0)) mkdir(filename);
#else
  if (access(filename, 0)) mkdir(filename, 0777);
#endif // WIN32 && !__CYGWIN__

  strlcat(filename, "/", sizeof(filename));
  strlcat(filename, safename, sizeof(filename));

  char *ext = filename + strlen(filename);
  if (ext >= (filename + sizeof(filename) - 5)) {
    fl_alert("The template name \"%s\" is too long!", c);
    return;
  }

  // Save the .fl file...
  strcpy(ext, ".fl");

  if (!access(filename, 0)) {
    if (fl_choice("The template \"%s\" already exists.\n"
                  "Do you want to replace it?", "Cancel",
		  "Replace", NULL, c) == 0) return;
  }

  if (!write_file(filename)) {
    fl_alert("Error writing %s: %s", filename, strerror(errno));
    return;
  }

#if defined(HAVE_LIBPNG) && defined(HAVE_LIBZ)
  // Get the screenshot, if any...
  Fl_Type *t;

  for (t = Fl_Type::first; t; t = t->next) {
    // Find the first window...
    if (t->is_window()) break;
  }

  if (!t) return;

  // Grab a screenshot...
  Fl_Window_Type *wt = (Fl_Window_Type *)t;
  uchar *pixels;
  int w, h;

  if ((pixels = wt->read_image(w, h)) == NULL) return;

  // Save to a PNG file...
  strcpy(ext, ".png");

  FILE *fp;

  if ((fp = fl_fopen(filename, "wb")) == NULL) {
    delete[] pixels;
    fl_alert("Error writing %s: %s", filename, strerror(errno));
    return;
  }

  png_structp pptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
  png_infop iptr = png_create_info_struct(pptr);
  png_bytep ptr = (png_bytep)pixels;

  png_init_io(pptr, fp);
  png_set_IHDR(pptr, iptr, w, h, 8, PNG_COLOR_TYPE_RGB, PNG_INTERLACE_NONE,
               PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
  png_set_sRGB(pptr, iptr, PNG_sRGB_INTENT_PERCEPTUAL);

  png_write_info(pptr, iptr);

  for (int i = h; i > 0; i --, ptr += w * 3) {
    png_write_row(pptr, ptr);
  }

  png_write_end(pptr, iptr);
  png_destroy_write_struct(&pptr, &iptr);

  fclose(fp);

#  if 0 // The original PPM output code...
  strcpy(ext, ".ppm");
  fp = fl_fopen(filename, "wb");
  fprintf(fp, "P6\n%d %d 255\n", w, h);
  fwrite(pixels, w * h, 3, fp);
  fclose(fp);
#  endif // 0

  delete[] pixels;
#endif // HAVE_LIBPNG && HAVE_LIBZ
}